

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k054539.c
# Opt level: O0

void k054539_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  double dVar1;
  ushort uVar2;
  long lVar3;
  ushort uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint3 *puVar9;
  byte *pbVar10;
  uint *puVar11;
  long lVar12;
  uint local_ac;
  uint local_a8;
  int cur_pval;
  int cur_val;
  int cur_pfrac;
  int pdelta;
  int fdelta;
  int rdelta;
  UINT32 cur_pos;
  double rbvol;
  double rvol;
  double lvol;
  double cur_gain;
  int pan;
  int bval;
  int vol;
  int delta;
  k054539_channel *chan;
  UINT8 *base2;
  UINT8 *base1;
  double rval;
  double lval;
  UINT32 ch;
  UINT32 sample;
  INT16 *rbase;
  k054539_state *info;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *param_local;
  
  lVar3 = *(long *)((long)param + 0xb10);
  if ((*(byte *)((long)param + 0xb08) & 1) == 0) {
    memset(*outputs,0,(ulong)samples << 2);
    memset(outputs[1],0,(ulong)samples << 2);
  }
  else {
    for (lval._4_4_ = 0; lval._4_4_ != samples; lval._4_4_ = lval._4_4_ + 1) {
      if ((*(byte *)((long)param + 0x8d8) & 2) == 0) {
        rval = (double)(int)*(short *)(lVar3 + (ulong)*(ushort *)((long)param + 0xb18) * 2);
      }
      else {
        rval = 0.0;
      }
      *(undefined2 *)(lVar3 + (ulong)*(ushort *)((long)param + 0xb18) * 2) = 0;
      base1 = (UINT8 *)rval;
      for (lval._0_4_ = 0; lval._0_4_ < 8; lval._0_4_ = lval._0_4_ + 1) {
        if ((((uint)*(byte *)((long)param + 0xb05) & 1 << ((byte)lval._0_4_ & 0x1f)) != 0) &&
           (*(char *)((long)param + (ulong)lval._0_4_ + 0xbc0) == '\0')) {
          puVar9 = (uint3 *)((long)param + (ulong)(lval._0_4_ << 5) + 0x8d9);
          pbVar10 = (byte *)((long)param + (ulong)(lval._0_4_ << 1) + 0xad9);
          puVar11 = (uint *)((long)param + (ulong)lval._0_4_ * 0x10 + 0xb40);
          bval = (int)*puVar9;
          uVar6 = (uint)*(byte *)((long)puVar9 + 3);
          cur_gain._4_4_ = uVar6 + (byte)puVar9[1];
          if (0xff < cur_gain._4_4_) {
            cur_gain._4_4_ = 0xff;
          }
          uVar7 = (uint)*(byte *)((long)puVar9 + 5);
          if ((uVar7 < 0x81) || (0x8f < uVar7)) {
            if ((uVar7 < 0x11) || (0x1f < uVar7)) {
              cur_gain._0_4_ = 7;
            }
            else {
              cur_gain._0_4_ = uVar7 - 0x11;
            }
          }
          else {
            cur_gain._0_4_ = uVar7 - 0x81;
          }
          dVar1 = *(double *)((long)param + (ulong)lval._0_4_ * 8 + 0x880);
          rvol = *(double *)((long)param + (long)(int)uVar6 * 8 + 8) *
                 *(double *)((long)param + (long)cur_gain._0_4_ * 8 + 0x808) * dVar1;
          if (1.8 < rvol) {
            rvol = 1.8;
          }
          rbvol = *(double *)((long)param + (long)(int)uVar6 * 8 + 8) *
                  *(double *)((long)param + (long)(0xe - cur_gain._0_4_) * 8 + 0x808) * dVar1;
          if (1.8 < rbvol) {
            rbvol = 1.8;
          }
          _rdelta = (*(double *)((long)param + (long)(int)cur_gain._4_4_ * 8 + 8) * dVar1) / 2.0;
          if (1.8 < _rdelta) {
            _rdelta = 1.8;
          }
          uVar4 = *(ushort *)((long)puVar9 + 6);
          uVar2 = *(ushort *)((long)param + 0xb18);
          fdelta = (int)puVar9[3];
          if ((*pbVar10 & 0x20) == 0) {
            cur_pfrac = -0x10000;
            cur_val = 1;
          }
          else {
            bval = -bval;
            cur_pfrac = 0x10000;
            cur_val = -1;
          }
          if (fdelta == *puVar11) {
            cur_pval = puVar11[1];
            local_a8 = puVar11[2];
            local_ac = puVar11[3];
          }
          else {
            *puVar11 = fdelta;
            cur_pval = 0;
            local_a8 = 0;
            local_ac = 0;
          }
          bVar5 = *pbVar10 & 0xc;
          if ((*pbVar10 & 0xc) == 0) {
            cur_pval = bval + cur_pval;
            do {
              if ((cur_pval & 0xffff0000U) == 0) goto LAB_001bad74;
              cur_pval = cur_pfrac + cur_pval;
              fdelta = cur_val + fdelta;
              local_ac = local_a8;
              local_a8 = (uint)(short)((ushort)*(byte *)(*(long *)((long)param + 0xb30) +
                                                        (ulong)(fdelta & *(uint *)((long)param +
                                                                                  0xb3c))) << 8);
              if ((local_a8 == 0xffff8000) && ((pbVar10[1] & 1) != 0)) {
                fdelta = (int)puVar9[2];
                local_a8 = (uint)(short)((ushort)*(byte *)(*(long *)((long)param + 0xb30) +
                                                          (ulong)(fdelta & *(uint *)((long)param +
                                                                                    0xb3c))) << 8);
              }
            } while (local_a8 != 0xffff8000);
            k054539_keyoff((k054539_state *)param,lval._0_4_);
            local_a8 = 0;
          }
          else if (bVar5 == 4) {
            cur_pval = bval + cur_pval;
            do {
              if ((cur_pval & 0xffff0000U) == 0) goto LAB_001bad74;
              cur_pval = cur_pfrac + cur_pval;
              fdelta = cur_val * 2 + fdelta;
              local_ac = local_a8;
              local_a8 = (uint)CONCAT11(*(undefined1 *)
                                         (*(long *)((long)param + 0xb30) +
                                         (ulong)(fdelta + 1U & *(uint *)((long)param + 0xb3c))),
                                        *(undefined1 *)
                                         (*(long *)((long)param + 0xb30) +
                                         (ulong)(fdelta & *(uint *)((long)param + 0xb3c))));
              if ((local_a8 == 0xffff8000) && ((pbVar10[1] & 1) != 0)) {
                fdelta = (int)puVar9[2];
                local_a8 = (uint)CONCAT11(*(undefined1 *)
                                           (*(long *)((long)param + 0xb30) +
                                           (ulong)(fdelta + 1U & *(uint *)((long)param + 0xb3c))),
                                          *(undefined1 *)
                                           (*(long *)((long)param + 0xb30) +
                                           (ulong)(fdelta & *(uint *)((long)param + 0xb3c))));
              }
            } while (local_a8 != 0xffff8000);
            k054539_keyoff((k054539_state *)param,lval._0_4_);
            local_a8 = 0;
          }
          else if (bVar5 == 8) {
            fdelta = fdelta << 1;
            cur_pval = cur_pval << 1;
            if ((cur_pval & 0x10000U) != 0) {
              cur_pval = cur_pval & 0xffff;
              fdelta = fdelta | 1;
            }
            cur_pval = bval + cur_pval;
            while (uVar6 = local_a8, (cur_pval & 0xffff0000U) != 0) {
              cur_pval = cur_pfrac + cur_pval;
              fdelta = cur_val + fdelta;
              local_ac = local_a8;
              local_a8 = (uint)*(byte *)(*(long *)((long)param + 0xb30) +
                                        (ulong)((uint)fdelta >> 1 & *(uint *)((long)param + 0xb3c)))
              ;
              if ((local_a8 == 0x88) && ((pbVar10[1] & 1) != 0)) {
                fdelta = (uint)puVar9[2] << 1;
                local_a8 = (uint)*(byte *)(*(long *)((long)param + 0xb30) +
                                          (ulong)((uint)puVar9[2] & *(uint *)((long)param + 0xb3c)))
                ;
              }
              if (local_a8 == 0x88) {
                k054539_keyoff((k054539_state *)param,lval._0_4_);
                local_a8 = 0;
                break;
              }
              if ((fdelta & 1U) == 0) {
                local_a8 = local_a8 & 0xf;
              }
              else {
                local_a8 = (int)local_a8 >> 4;
              }
              local_a8 = uVar6 + (int)k054539_update::dpcm[(int)local_a8];
              if ((int)local_a8 < -0x8000) {
                local_a8 = 0xffff8000;
              }
              else if (0x7fff < (int)local_a8) {
                local_a8 = 0x7fff;
              }
            }
            cur_pval = cur_pval >> 1;
            if ((fdelta & 1U) != 0) {
              cur_pval = cur_pval | 0x8000;
            }
            fdelta = (uint)fdelta >> 1;
          }
LAB_001bad74:
          rval = (double)(int)local_a8 * rvol + rval;
          base1 = (UINT8 *)((double)(int)local_a8 * rbvol + (double)base1);
          lVar12 = (long)(int)((((int)(uint)uVar4 >> 3) + (uint)uVar2 & 0x3fff) +
                               (uint)*(ushort *)((long)param + 0xb18) & 0x1fff);
          *(short *)(lVar3 + lVar12 * 2) =
               *(short *)(lVar3 + lVar12 * 2) + (short)(int)((double)(int)local_a8 * _rdelta);
          *puVar11 = fdelta;
          puVar11[1] = cur_pval;
          puVar11[3] = local_ac;
          puVar11[2] = local_a8;
          iVar8 = k054539_regupdate((k054539_state *)param);
          if (iVar8 != 0) {
            *(char *)(puVar9 + 3) = (char)fdelta;
            *(char *)((long)puVar9 + 0xd) = (char)((uint)fdelta >> 8);
            *(char *)((long)puVar9 + 0xe) = (char)((uint)fdelta >> 0x10);
          }
        }
      }
      *(ushort *)((long)param + 0xb18) = *(short *)((long)param + 0xb18) + 1U & 0x1fff;
      (*outputs)[lval._4_4_] = (int)rval;
      outputs[1][lval._4_4_] = (int)(double)base1;
    }
  }
  return;
}

Assistant:

static void k054539_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	k054539_state *info = (k054539_state *)param;
#define VOL_CAP 1.80

	static const INT16 dpcm[16] = {
		0 * 0x100,     1 * 0x100,   4 * 0x100,   9 * 0x100,  16 * 0x100, 25 * 0x100, 36 * 0x100, 49 * 0x100,
		-64 * 0x100, -49 * 0x100, -36 * 0x100, -25 * 0x100, -16 * 0x100, -9 * 0x100, -4 * 0x100, -1 * 0x100
	};

	INT16 *rbase = (INT16 *)info->ram;
	UINT32 sample, ch;

	if(!(info->regs[0x22f] & 1))
	{
		memset(outputs[0], 0, samples*sizeof(*outputs[0]));
		memset(outputs[1], 0, samples*sizeof(*outputs[1]));
		return;
	}

	for(sample = 0; sample != samples; sample++) {
		double lval, rval;
		if(!(info->flags & K054539_DISABLE_REVERB))
			lval = rval = rbase[info->reverb_pos];
		else
			lval = rval = 0;
		rbase[info->reverb_pos] = 0;

		for(ch=0; ch<8; ch++)
			if(info->regs[0x22c] & (1<<ch) && ! info->Muted[ch]) {
				UINT8 *base1 = info->regs + 0x20*ch;
				UINT8 *base2 = info->regs + 0x200 + 0x2*ch;
				k054539_channel *chan = info->channels + ch;
				int delta, vol, bval, pan;
				double cur_gain, lvol, rvol, rbvol;
				UINT32 cur_pos;
				int rdelta, fdelta, pdelta;
				int cur_pfrac, cur_val, cur_pval;

				delta = base1[0x00] | (base1[0x01] << 8) | (base1[0x02] << 16);

				vol = base1[0x03];

				bval = vol + base1[0x04];
				if (bval > 255)
					bval = 255;

				pan = base1[0x05];
				// DJ Main: 81-87 right, 88 middle, 89-8f left
				if (pan >= 0x81 && pan <= 0x8f)
					pan -= 0x81;
				else if (pan >= 0x11 && pan <= 0x1f)
					pan -= 0x11;
				else
					pan = 0x18 - 0x11;

				cur_gain = info->gain[ch];

				lvol = info->voltab[vol] * info->pantab[pan] * cur_gain;
				if (lvol > VOL_CAP)
					lvol = VOL_CAP;

				rvol = info->voltab[vol] * info->pantab[0xe - pan] * cur_gain;
				if (rvol > VOL_CAP)
					rvol = VOL_CAP;

				rbvol= info->voltab[bval] * cur_gain / 2;
				if (rbvol > VOL_CAP)
					rbvol = VOL_CAP;

				rdelta = (base1[6] | (base1[7] << 8)) >> 3;
				rdelta = (rdelta + info->reverb_pos) & 0x3fff;

				cur_pos = base1[0x0c] | (base1[0x0d] << 8) | (base1[0x0e] << 16);

				if(base2[0] & 0x20) {
					delta = -delta;
					fdelta = +0x10000;
					pdelta = -1;
				} else {
					fdelta = -0x10000;
					pdelta = +1;
				}

				if(cur_pos != chan->pos) {
					chan->pos = cur_pos;
					cur_pfrac = 0;
					cur_val = 0;
					cur_pval = 0;
				} else {
					cur_pfrac = chan->pfrac;
					cur_val = chan->val;
					cur_pval = chan->pval;
				}

				switch(base2[0] & 0xc) {
				case 0x0: { // 8bit pcm
					cur_pfrac += delta;
					while(cur_pfrac & ~0xffff) {
						cur_pfrac += fdelta;
						cur_pos += pdelta;

						cur_pval = cur_val;
						cur_val = (INT16)(info->rom[cur_pos & info->rom_mask] << 8);
						if(cur_val == (INT16)0x8000 && (base2[1] & 1)) {
							cur_pos = base1[0x08] | (base1[0x09] << 8) | (base1[0x0a] << 16);
							cur_val = (INT16)(info->rom[cur_pos & info->rom_mask] << 8);
						}
						if(cur_val == (INT16)0x8000) {
							k054539_keyoff(info, ch);
							cur_val = 0;
							break;
						}
					}
					break;
				}

				case 0x4: { // 16bit pcm lsb first
					pdelta <<= 1;

					cur_pfrac += delta;
					while(cur_pfrac & ~0xffff) {
						cur_pfrac += fdelta;
						cur_pos += pdelta;

						cur_pval = cur_val;
						cur_val = (INT16)(info->rom[cur_pos & info->rom_mask] | info->rom[(cur_pos+1) & info->rom_mask]<<8);
						if(cur_val == (INT16)0x8000 && (base2[1] & 1)) {
							cur_pos = base1[0x08] | (base1[0x09] << 8) | (base1[0x0a] << 16);
							cur_val = (INT16)(info->rom[cur_pos & info->rom_mask] | info->rom[(cur_pos+1) & info->rom_mask]<<8);
						}
						if(cur_val == (INT16)0x8000) {
							k054539_keyoff(info, ch);
							cur_val = 0;
							break;
						}
					}
					break;
				}

				case 0x8: { // 4bit dpcm
					cur_pos <<= 1;
					cur_pfrac <<= 1;
					if(cur_pfrac & 0x10000) {
						cur_pfrac &= 0xffff;
						cur_pos |= 1;
					}

					cur_pfrac += delta;
					while(cur_pfrac & ~0xffff) {
						cur_pfrac += fdelta;
						cur_pos += pdelta;

						cur_pval = cur_val;
						cur_val = info->rom[(cur_pos>>1) & info->rom_mask];
						if(cur_val == 0x88 && (base2[1] & 1)) {
							cur_pos = (base1[0x08] | (base1[0x09] << 8) | (base1[0x0a] << 16)) << 1;
							cur_val = info->rom[(cur_pos>>1) & info->rom_mask];
						}
						if(cur_val == 0x88) {
							k054539_keyoff(info, ch);
							cur_val = 0;
							break;
						}
						if(cur_pos & 1)
							cur_val >>= 4;
						else
							cur_val &= 15;
						cur_val = cur_pval + dpcm[cur_val];
						if(cur_val < -32768)
							cur_val = -32768;
						else if(cur_val > 32767)
							cur_val = 32767;
					}

					cur_pfrac >>= 1;
					if(cur_pos & 1)
						cur_pfrac |= 0x8000;
					cur_pos >>= 1;
					break;
				}
				default:
					LOG(("Unknown sample type %x for channel %d\n", base2[0] & 0xc, ch));
					break;
				}
				lval += cur_val * lvol;
				rval += cur_val * rvol;
				rbase[(rdelta + info->reverb_pos) & 0x1fff] += (INT16)(cur_val*rbvol);

				chan->pos = cur_pos;
				chan->pfrac = cur_pfrac;
				chan->pval = cur_pval;
				chan->val = cur_val;

				if(k054539_regupdate(info)) {
					base1[0x0c] = cur_pos     & 0xff;
					base1[0x0d] = cur_pos>> 8 & 0xff;
					base1[0x0e] = cur_pos>>16 & 0xff;
				}
			}
		info->reverb_pos = (info->reverb_pos + 1) & 0x1fff;
		outputs[0][sample] = (DEV_SMPL)lval;
		outputs[1][sample] = (DEV_SMPL)rval;
	}
}